

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidEnum(ApiErrorsTest *this,bool *result)

{
  GLenum value;
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  char *local_1d8 [4];
  stringstream message;
  ostream local_1a8;
  
  for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 4) {
    value = *(GLenum *)((long)invalidEnum::type_array + lVar3);
    std::__cxx11::stringstream::stringstream((stringstream *)&message);
    poVar1 = std::operator<<(&local_1a8,"VertexAttribLPointer(..., ");
    pcVar2 = glu::getTypeName(value);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1," /* type */, ...)");
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,value,0,(void *)0x0);
    std::__cxx11::stringbuf::str();
    verifyError(this,0x500,local_1d8[0],0x19e,result);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&message);
  }
  (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,(void *)0x0);
  verifyError(this,0,"VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)",0x1a2,result);
  return;
}

Assistant:

void ApiErrorsTest::invalidEnum(bool& result)
{
	/*
	 *b) GL_INVALID_ENUM should be generated by glVertexAttribLPointer()
	 *   if <type> is not GL_DOUBLE;
	 */

	static const GLenum type_array[] = { GL_BYTE,
										 GL_UNSIGNED_BYTE,
										 GL_SHORT,
										 GL_UNSIGNED_SHORT,
										 GL_INT,
										 GL_UNSIGNED_INT,
										 GL_HALF_FLOAT,
										 GL_FLOAT,
										 GL_FIXED,
										 GL_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_10F_11F_11F_REV };
	static const GLuint type_array_length = sizeof(type_array) / sizeof(type_array[0]);

	for (GLuint i = 0; i < type_array_length; ++i)
	{
		const GLenum type = type_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << glu::getTypeName(type) << " /* type */, ...)";

		gl.vertexAttribLPointer(1 /*index */, 4 /*size */, type, 0 /* stride */, 0 /* pointer */);
		verifyError(GL_INVALID_ENUM, message.str().c_str(), __LINE__, result);
	}

	gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_NO_ERROR, "VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)", __LINE__, result);
}